

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeTrace.cpp
# Opt level: O0

string * slang::escapeString_abi_cxx11_(string_view src)

{
  char c_00;
  bool bVar1;
  int iVar2;
  const_iterator pvVar3;
  string *in_RDI;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string_view *__range1;
  string *result;
  char __c;
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *local_30;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  this = in_RDI;
  std::__cxx11::string::string(in_stack_ffffffffffffffb0);
  local_30 = std::basic_string_view<char,_std::char_traits<char>_>::begin(&local_18);
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::end(&local_18);
  for (; local_30 != pvVar3; local_30 = local_30 + 1) {
    c_00 = *local_30;
    iVar2 = (int)c_00;
    __c = c_00 >> 7;
    if ((((iVar2 - 8U < 3) || (iVar2 - 0xcU < 2)) || (iVar2 == 0x22)) ||
       ((iVar2 == 0x2f || (iVar2 == 0x5c)))) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (this,__c);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (this,__c);
    }
    else {
      bVar1 = isPrintableASCII(c_00);
      if (bVar1) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (this,__c);
      }
    }
  }
  return in_RDI;
}

Assistant:

static std::string escapeString(std::string_view src) {
    std::string result;
    for (char c : src) {
        switch (c) {
            case '"':
            case '/':
            case '\\':
            case '\b':
            case '\f':
            case '\n':
            case '\r':
            case '\t':
                result += '\\';
                result += c;
                break;
            default:
                if (isPrintableASCII(c))
                    result += c;
                break;
        }
    }
    return result;
}